

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O3

void vorbis_staticbook_destroy(static_codebook *b)

{
  if (b->allocedp != 0) {
    if (b->quantlist != (long *)0x0) {
      free(b->quantlist);
    }
    if (b->lengthlist != (char *)0x0) {
      free(b->lengthlist);
    }
    free(b);
    return;
  }
  return;
}

Assistant:

void vorbis_staticbook_destroy(static_codebook *b){
  if(b->allocedp){
    if(b->quantlist)_ogg_free(b->quantlist);
    if(b->lengthlist)_ogg_free(b->lengthlist);
    memset(b,0,sizeof(*b));
    _ogg_free(b);
  } /* otherwise, it is in static memory */
}